

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsModelUtils.cpp
# Opt level: O2

string * utilPresolveRuleTypeToString_abi_cxx11_(string *__return_storage_ptr__,HighsInt rule_type)

{
  allocator *paVar1;
  char *pcVar2;
  allocator local_17;
  allocator local_16;
  allocator local_15;
  allocator local_14;
  allocator local_13;
  allocator local_12;
  allocator local_11;
  allocator local_10;
  allocator local_f;
  allocator local_e;
  allocator local_d;
  allocator local_c;
  allocator local_b;
  allocator local_a;
  allocator local_9;
  
  switch(rule_type) {
  case 0:
    pcVar2 = "Empty row";
    paVar1 = &local_9;
    break;
  case 1:
    pcVar2 = "Singleton row";
    paVar1 = &local_a;
    break;
  case 2:
    pcVar2 = "Redundant row";
    paVar1 = &local_b;
    break;
  case 3:
    pcVar2 = "Empty column";
    paVar1 = &local_c;
    break;
  case 4:
    pcVar2 = "Fixed column";
    paVar1 = &local_d;
    break;
  case 5:
    pcVar2 = "Dominated col";
    paVar1 = &local_e;
    break;
  case 6:
    pcVar2 = "Forcing row";
    paVar1 = &local_f;
    break;
  case 7:
    pcVar2 = "Forcing col";
    paVar1 = &local_10;
    break;
  case 8:
    pcVar2 = "Free col substitution";
    paVar1 = &local_11;
    break;
  case 9:
    pcVar2 = "Doubleton equation";
    paVar1 = &local_12;
    break;
  case 10:
    pcVar2 = "Dependent equations";
    paVar1 = &local_13;
    break;
  case 0xb:
    pcVar2 = "Dependent free columns";
    paVar1 = &local_14;
    break;
  case 0xc:
    pcVar2 = "Aggregator";
    paVar1 = &local_15;
    break;
  case 0xd:
    pcVar2 = "Parallel rows and columns";
    paVar1 = &local_16;
    break;
  default:
    pcVar2 = "????";
    paVar1 = &local_17;
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar2,paVar1);
  return __return_storage_ptr__;
}

Assistant:

std::string utilPresolveRuleTypeToString(const HighsInt rule_type) {
  if (rule_type == kPresolveRuleEmptyRow) {
    return "Empty row";
  } else if (rule_type == kPresolveRuleSingletonRow) {
    return "Singleton row";
  } else if (rule_type == kPresolveRuleRedundantRow) {
    return "Redundant row";
  } else if (rule_type == kPresolveRuleEmptyCol) {
    return "Empty column";
  } else if (rule_type == kPresolveRuleFixedCol) {
    return "Fixed column";
  } else if (rule_type == kPresolveRuleDominatedCol) {
    return "Dominated col";
  } else if (rule_type == kPresolveRuleForcingRow) {
    return "Forcing row";
  } else if (rule_type == kPresolveRuleForcingCol) {
    return "Forcing col";
  } else if (rule_type == kPresolveRuleFreeColSubstitution) {
    return "Free col substitution";
  } else if (rule_type == kPresolveRuleDoubletonEquation) {
    return "Doubleton equation";
  } else if (rule_type == kPresolveRuleDependentEquations) {
    return "Dependent equations";
  } else if (rule_type == kPresolveRuleDependentFreeCols) {
    return "Dependent free columns";
  } else if (rule_type == kPresolveRuleAggregator) {
    return "Aggregator";
  } else if (rule_type == kPresolveRuleParallelRowsAndCols) {
    return "Parallel rows and columns";
  }
  assert(1 == 0);
  return "????";
}